

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int PrepareLine(void)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  CStringsList *this;
  byte *local_30;
  byte *lp2;
  SRepeatStack *dup;
  
  ListSilentOrExternalEmits();
  CompiledCurrentLine = CompiledCurrentLine + 1;
  bVar2 = std::stack<SRepeatStack,_std::deque<SRepeatStack,_std::allocator<SRepeatStack>_>_>::empty
                    (&RepeatStack);
  if ((bVar2) ||
     (pvVar4 = std::stack<SRepeatStack,_std::deque<SRepeatStack,_std::allocator<SRepeatStack>_>_>::
               top(&RepeatStack), ((ulong)pvVar4[1].MultiArg & 1) != 0)) {
    lp = ReplaceDefine(line);
    if (DeviceID != (char *)0x0) {
      CDevice::CheckPage(Device,CHECK_NO_EMIT);
    }
    ListAddress = CurAddress;
    if (ConvertEncoding == 0) {
      for (local_30 = (byte *)lp; *local_30 != 0; local_30 = local_30 + 1) {
        if (0x7f < *local_30) {
          *local_30 = win2dos[(int)(*local_30 - 0x80)];
        }
      }
    }
    dup._4_4_ = 0;
  }
  else {
    lp = line;
    this = (CStringsList *)operator_new(0x28);
    CStringsList::CStringsList(this,lp,(CStringsList *)0x0);
    *(CStringsList **)(*(long *)&pvVar4[1].MemoryBrackets + 8) = this;
    uVar1 = *(undefined8 *)(*(long *)&pvVar4[1].MemoryBrackets + 8);
    pvVar4[1].MemoryBrackets = (int)uVar1;
    pvVar4[1].IsNextEnabled = (int)((ulong)uVar1 >> 0x20);
    iVar3 = islabchar(*lp);
    if (iVar3 != 0) {
      if (((Options::syx & 1) != 0) && (iVar3 = ParseDirective_REPT(), iVar3 != 0)) {
        return 1;
      }
      while (iVar3 = islabchar(*lp), iVar3 != 0) {
        lp = lp + 1;
      }
      if (*lp == ':') {
        lp = lp + 1;
      }
    }
    ParseDirective_REPT();
    dup._4_4_ = 1;
  }
  return dup._4_4_;
}

Assistant:

int PrepareLine() {
	ListSilentOrExternalEmits();

	++CompiledCurrentLine;
	if (!RepeatStack.empty()) {
		SRepeatStack& dup = RepeatStack.top();
		if (!dup.IsInWork) {
			lp = line;
			dup.Pointer->next = new CStringsList(lp);
			dup.Pointer = dup.Pointer->next;
#ifdef DEBUG_COUT_PARSE_LINE
			fprintf(stderr, ">%d %d %c%ld-%d [%s]\n", pass, CurSourcePos.line,
					(!RepeatStack.empty() && RepeatStack.top().IsInWork ? '!' : '.'),RepeatStack.size(),
					(!RepeatStack.empty() ? RepeatStack.top().Level : 0), line);
#endif
			// check if there's some label at beginning of the line, skip it
			if (islabchar(*lp)) {
				// if directives are enabled at beginning of line, check if it is nested DUP/REPT/WHILE/EDUP...
				if (Options::syx.IsPseudoOpBOF && ParseDirective_REPT()) return 1;
				// skip label chars and trailing colon
				while (islabchar(*lp)) ++lp;
				if (':' == *lp) ++lp;
			}
			// catch any nested DUP/WHILE/REPT and EDUP directives
			ParseDirective_REPT();
			return 1;
		}
	}
#ifdef DEBUG_COUT_PARSE_LINE
	fprintf(stderr, "|%d %d %c%ld-%d [%s]\n", pass, CurSourcePos.line,
			(!RepeatStack.empty() && RepeatStack.top().IsInWork ? '!' : '.'), RepeatStack.size(),
			(!RepeatStack.empty() ? RepeatStack.top().Level : 0), line);
#endif
	lp = ReplaceDefine(line);

#ifdef DEBUG_COUT_PARSE_LINE
	fprintf(stderr,"rdOut [%s]->[%s] %d\n", line, lp, comlin);
#endif

	// update current address by memory wrapping, current page, etc... (before the label is defined)
	if (DeviceID)	Device->CheckPage(CDevice::CHECK_NO_EMIT);
	ListAddress = CurAddress;

	if (!ConvertEncoding) {
		byte* lp2 = (byte*) lp;
		while (*lp2) {
			if (128 <= *lp2) {
				*lp2 = win2dos[(*lp2) - 128];
			}
			++lp2;
		}
	}
	return 0;
}